

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fIntegerStateQueryTests.cpp
# Opt level: O1

void __thiscall
deqp::gles2::Functional::anon_unknown_2::StencilMaskSeparateTestCase::test
          (StencilMaskSeparateTestCase *this)

{
  uint uVar1;
  RenderTarget *pRVar2;
  uint mask;
  uint uVar3;
  
  pRVar2 = Context::getRenderTarget((this->super_ApiCase).super_TestCase.m_context);
  uVar1 = pRVar2->m_stencilBits;
  (*this->m_verifier->_vptr_StateVerifier[9])
            (this->m_verifier,
             (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
             (ulong)this->m_testTargetName,(ulong)uVar1);
  uVar3 = 0;
  ApiCase::expectError(&this->super_ApiCase,0);
  if (0 < (int)uVar1) {
    do {
      mask = 1 << ((byte)uVar3 & 0x1f);
      glu::CallLogWrapper::glStencilFuncSeparate
                (&(this->super_ApiCase).super_CallLogWrapper,this->m_stencilFuncTargetFace,0x207,0,
                 mask);
      ApiCase::expectError(&this->super_ApiCase,0);
      (*this->m_verifier->_vptr_StateVerifier[2])
                (this->m_verifier,
                 (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
                 (ulong)this->m_testTargetName,(ulong)mask);
      ApiCase::expectError(&this->super_ApiCase,0);
      uVar3 = uVar3 + 1;
    } while (uVar1 != uVar3);
  }
  return;
}

Assistant:

void test (void)
	{
		const int stencilBits = m_context.getRenderTarget().getStencilBits();

		m_verifier->verifyStencilMaskInitial(m_testCtx, m_testTargetName, stencilBits);
		expectError(GL_NO_ERROR);

		for (int stencilBit = 0; stencilBit < stencilBits; ++stencilBit)
		{
			const int mask = 1 << stencilBit;

			glStencilFuncSeparate(m_stencilFuncTargetFace, GL_ALWAYS, 0, mask);
			expectError(GL_NO_ERROR);

			m_verifier->verifyInteger(m_testCtx, m_testTargetName, mask);
			expectError(GL_NO_ERROR);
		}
	}